

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.c
# Opt level: O3

cgltf_result
cgltf_load_buffer_base64(cgltf_options *options,cgltf_size size,char *base64,void **out_data)

{
  char cVar1;
  cgltf_result cVar2;
  void *pvVar3;
  int iVar4;
  uint uVar5;
  _func_void_ptr_void_ptr_cgltf_size *p_Var6;
  cgltf_size cVar7;
  uint uVar8;
  uint uVar9;
  _func_void_void_ptr_void_ptr *p_Var10;
  bool bVar11;
  
  p_Var6 = cgltf_default_alloc;
  if (options->memory_alloc != (_func_void_ptr_void_ptr_cgltf_size *)0x0) {
    p_Var6 = options->memory_alloc;
  }
  p_Var10 = cgltf_default_free;
  if (options->memory_free != (_func_void_void_ptr_void_ptr *)0x0) {
    p_Var10 = options->memory_free;
  }
  pvVar3 = (*p_Var6)(options->memory_user_data,size);
  if (pvVar3 == (void *)0x0) {
    cVar2 = cgltf_result_out_of_memory;
  }
  else {
    if (size != 0) {
      cVar7 = 0;
      uVar5 = 0;
      uVar8 = 0;
      do {
        uVar9 = uVar5;
        if (uVar5 < 8) {
          do {
            cVar1 = *base64;
            iVar4 = (int)cVar1;
            uVar5 = iVar4 - 0x41;
            if (0x19 < uVar5) {
              if (iVar4 - 0x61U < 0x1a) {
                uVar5 = iVar4 - 0x47;
              }
              else if (iVar4 - 0x30U < 10) {
                uVar5 = iVar4 + 4;
              }
              else {
                uVar5 = 0x3e;
                if (cVar1 != '+') {
                  if (cVar1 != '/') {
                    (*p_Var10)(options->memory_user_data,pvVar3);
                    return cgltf_result_io_error;
                  }
                  uVar5 = 0x3f;
                }
              }
            }
            base64 = base64 + 1;
            uVar8 = uVar8 << 6 | uVar5;
            uVar5 = uVar9 + 6;
            bVar11 = uVar9 < 2;
            uVar9 = uVar5;
          } while (bVar11);
        }
        uVar5 = uVar5 - 8;
        *(char *)((long)pvVar3 + cVar7) = (char)(uVar8 >> ((byte)uVar5 & 0x1f));
        cVar7 = cVar7 + 1;
      } while (cVar7 != size);
    }
    *out_data = pvVar3;
    cVar2 = cgltf_result_success;
  }
  return cVar2;
}

Assistant:

cgltf_result cgltf_load_buffer_base64(const cgltf_options* options, cgltf_size size, const char* base64, void** out_data)
{
    void* (*memory_alloc)(void*, cgltf_size) = options->memory_alloc ? options->memory_alloc : &cgltf_default_alloc;
    void (*memory_free)(void*, void*) = options->memory_free ? options->memory_free : &cgltf_default_free;

    unsigned char* data = (unsigned char*)memory_alloc(options->memory_user_data, size);
    if (!data)
    {
        return cgltf_result_out_of_memory;
    }

    unsigned int buffer = 0;
    unsigned int buffer_bits = 0;

    for (cgltf_size i = 0; i < size; ++i)
    {
        while (buffer_bits < 8)
        {
            char ch = *base64++;

            int index =
                (unsigned)(ch - 'A') < 26 ? (ch - 'A') :
                (unsigned)(ch - 'a') < 26 ? (ch - 'a') + 26 :
                (unsigned)(ch - '0') < 10 ? (ch - '0') + 52 :
                ch == '+' ? 62 :
                ch == '/' ? 63 :
                -1;

            if (index < 0)
            {
                memory_free(options->memory_user_data, data);
                return cgltf_result_io_error;
            }

            buffer = (buffer << 6) | index;
            buffer_bits += 6;
        }

        data[i] = (unsigned char)(buffer >> (buffer_bits - 8));
        buffer_bits -= 8;
    }

    *out_data = data;

    return cgltf_result_success;
}